

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_d.c
# Opt level: O1

void test_option_d(void)

{
  wchar_t wVar1;
  
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
                     ,L'$',"dir",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
                      ,L'%',"dir/file",L'Ƥ',L'\xffffffff',(void *)0x0);
  wVar1 = systemf("echo dir/file | %s -o > archive.cpio 2>archive.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
                      ,L')',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
             ,L'*',"1 block\n","archive.err");
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
                      ,L'+',"archive.cpio",0x200);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
                     ,L'.',"without-d",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
                  ,L'/',"without-d");
  wVar1 = systemf("%s -i < ../archive.cpio >out 2>err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
                      ,L'1',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
             ,L'2',"out");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
             ,L'4',"dir/file");
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
                  ,L'7',"..");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
                     ,L'8',"with-d",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
                  ,L'9',"with-d");
  wVar1 = systemf("%s -id < ../archive.cpio >out 2>err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
                      ,L';',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
             ,L'<',"out");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
             ,L'=',"1 block\n","err");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_d.c"
             ,L'?',"dir/file");
  return;
}

Assistant:

DEFINE_TEST(test_option_d)
{
	int r;

	/*
	 * Create a file in a directory.
	 */
	assertMakeDir("dir", 0755);
	assertMakeFile("dir/file", 0644, NULL);

	/* Create an archive. */
	r = systemf("echo dir/file | %s -o > archive.cpio 2>archive.err", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "archive.err");
	assertFileSize("archive.cpio", 512);

	/* Dearchive without -d, this should fail. */
	assertMakeDir("without-d", 0755);
	assertChdir("without-d");
	r = systemf("%s -i < ../archive.cpio >out 2>err", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("out");
	/* And the file should not be restored. */
	assertFileNotExists("dir/file");

	/* Dearchive with -d, this should succeed. */
	assertChdir("..");
	assertMakeDir("with-d", 0755);
	assertChdir("with-d");
	r = systemf("%s -id < ../archive.cpio >out 2>err", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("out");
	assertTextFileContents("1 block\n", "err");
	/* And the file should be restored. */
	assertFileExists("dir/file");
}